

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  time_t tVar4;
  bool bVar5;
  long local_440;
  size_t n_2;
  size_t n_1;
  size_t n;
  char input [1024];
  _Bool is_valid;
  char **argv_local;
  int argc_local;
  
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  do {
    printf("Please enter a string, consisting only of alphanumeric characters and spaces:\n");
    printf("> ");
    fgets((char *)&n,0x400,_stdin);
    bVar1 = true;
    n_1 = 0;
    while( true ) {
      bVar5 = false;
      if (input[n_1 - 8] != '\n') {
        bVar5 = input[n_1 - 8] != '\0';
      }
      if (!bVar5) goto LAB_00101304;
      iVar3 = toupper((int)input[n_1 - 8]);
      input[n_1 - 8] = (char)iVar3;
      if ((((input[n_1 - 8] < 'A') || ('Z' < input[n_1 - 8])) &&
          ((input[n_1 - 8] < '0' || ('9' < input[n_1 - 8])))) &&
         ((input[n_1 - 8] == ' ' && (input[n_1 - 8] == '-')))) break;
      n_1 = n_1 + 1;
    }
    bVar1 = false;
LAB_00101304:
    if (input[n_1 - 8] == '\n') {
      input[n_1 - 8] = '\0';
    }
    if (bVar1) {
      printf("\n");
      printf("The encoded version is as follows:\n");
      for (n_2 = 0; input[n_2 - 8] != '\0'; n_2 = n_2 + 1) {
        cVar2 = encode(input[n_2 - 8]);
        printf("%c",(ulong)(uint)(int)cVar2);
      }
      printf("\n\n");
      printf("The decoded version is as follows:\n");
      for (local_440 = 0; input[local_440 + -8] != '\0'; local_440 = local_440 + 1) {
        cVar2 = decode(input[local_440 + -8]);
        printf("%c",(ulong)(uint)(int)cVar2);
      }
      printf("\n");
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  bool is_valid = false;
  char input[1024];

  srand((unsigned int)time(0));

  do {
    printf("Please enter a string, consisting only of alphanumeric characters and spaces:\n");
    printf("> ");

    fgets(input, sizeof input, stdin);

    is_valid = true;
    size_t n = 0;
    for (; input[n] != '\n' && input[n] != 0; n++) {
      input[n] = (char)toupper(input[n]);
      if (!( // <- notice the !
          (input[n] >= 'A' && input[n] <= 'Z')
          || (input[n] >= '0' && input[n] <= '9')
          || input[n] != ' '
          || input[n] != '-')
        ) {
        is_valid = false;
        break;
      }
    }
    if (input[n] == '\n') input[n] = 0;
  } while (!is_valid);

  printf("\n");

  printf("The encoded version is as follows:\n");
  for (size_t n = 0; input[n]; n++) {
    printf("%c", encode(input[n]));
  }
  printf("\n\n");

  printf("The decoded version is as follows:\n");
  for (size_t n = 0; input[n]; n++) {
    printf("%c", decode(input[n]));
  }
  printf("\n");

  return 0;
}